

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ns_core.c
# Opt level: O2

void WebRtcNs_AnalyzeCore(NoiseSuppressionC *self,float *speechFrame)

{
  undefined4 uVar1;
  undefined4 uVar2;
  unkuint9 Var3;
  long lVar4;
  int iVar5;
  int iVar6;
  size_t i;
  float *pfVar7;
  size_t i_1;
  ulong uVar8;
  float *pfVar9;
  long lVar10;
  long lVar11;
  size_t sVar12;
  ulong uVar13;
  long lVar14;
  uint uVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  double dVar20;
  double dVar21;
  double dVar22;
  float fVar24;
  undefined1 auVar23 [16];
  float fVar25;
  float fVar26;
  undefined1 auVar27 [16];
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  undefined1 local_12c8 [8];
  float fStack_12c0;
  float fStack_12bc;
  undefined1 local_12a8 [8];
  float fStack_12a0;
  float fStack_129c;
  float magn [129];
  float noise [129];
  float snrLocPost [129];
  float imag [129];
  float snrLocPrior [129];
  float real [256];
  float winData [256];
  
  if (self->initFlag != 1) {
    __assert_fail("self->initFlag == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/ns/ns_core.c"
                  ,0x429,"void WebRtcNs_AnalyzeCore(NoiseSuppressionC *, const float *)");
  }
  uVar15 = self->modelUpdatePars[0];
  uVar8 = (ulong)uVar15;
  UpdateBuffer(speechFrame,self->blockLen,self->anaLen,self->analyzeBuf);
  sVar12 = self->anaLen;
  Windowing(self->window,self->analyzeBuf,sVar12,winData);
  fVar16 = Energy(winData,sVar12);
  if ((fVar16 != 0.0) || (NAN(fVar16))) {
    self->blockInd = self->blockInd + 1;
    FFT(self,winData,sVar12,self->magnLen,real,imag,magn);
    fVar16 = 0.0;
    _local_12c8 = ZEXT816(0);
    uVar13 = 0;
    fVar28 = 0.0;
    _local_12a8 = _local_12c8;
    while( true ) {
      sVar12 = self->magnLen;
      if (sVar12 <= uVar13) break;
      fVar19 = real[uVar13];
      fVar24 = imag[uVar13];
      fVar31 = magn[uVar13];
      if ((4 < uVar13) && (self->blockInd < 0x32)) {
        fVar17 = logf((float)uVar13);
        fVar18 = logf(fVar31);
        local_12c8._4_4_ = (float)local_12c8._4_4_ + fVar17;
        local_12c8._0_4_ = (float)local_12c8._0_4_ + fVar18;
        fStack_12c0 = fStack_12c0 + extraout_XMM0_Db_00;
        fStack_12bc = fStack_12bc + extraout_XMM0_Db;
        local_12a8._4_4_ = (float)local_12a8._4_4_ + fVar17 * fVar17;
        local_12a8._0_4_ = (float)local_12a8._0_4_ + fVar17 * fVar18;
        fStack_12a0 = fStack_12a0 + fVar17 * extraout_XMM0_Db_00;
        fStack_129c = fStack_129c + fVar17 * extraout_XMM0_Db;
      }
      fVar16 = fVar16 + fVar19 * fVar19 + fVar24 * fVar24;
      fVar28 = fVar28 + fVar31;
      uVar13 = uVar13 + 1;
    }
    Var3 = (unkuint9)sVar12;
    self->signalEnergy = fVar16 / (float)(unkint9)Var3;
    self->sumMagn = fVar28;
    if (self->updates < 200) {
      self->updates = self->updates + 1;
    }
    for (uVar13 = 0; uVar13 < sVar12; uVar13 = uVar13 + 1) {
      dVar20 = log((double)magn[uVar13]);
      snrLocPost[uVar13] = (float)dVar20;
      sVar12 = self->magnLen;
    }
    lVar10 = 0;
    for (lVar11 = 0; lVar11 != 3; lVar11 = lVar11 + 1) {
      uVar8 = lVar11 * sVar12;
      lVar14 = sVar12 * lVar10;
      lVar4 = lVar14 + 0x1248;
      for (uVar13 = 0; sVar12 != uVar13; uVar13 = uVar13 + 1) {
        fVar19 = *(float *)((long)self->density + uVar13 * 4 + lVar14);
        fVar18 = (float)(~-(uint)(1.0 < fVar19) & 0x42200000 |
                        (uint)(40.0 / fVar19) & -(uint)(1.0 < fVar19));
        fVar24 = snrLocPost[uVar13];
        fVar31 = *(float *)((long)self->lquantile + uVar13 * 4 + lVar4 + -0x1248);
        iVar5 = self->counter[lVar11];
        fVar17 = (float)(iVar5 + 1);
        if (fVar24 <= fVar31) {
          fVar18 = fVar18 * -0.75;
        }
        else {
          fVar18 = fVar18 * 0.25;
        }
        fVar31 = fVar31 + fVar18 / fVar17;
        *(float *)((long)self->lquantile + uVar13 * 4 + lVar4 + -0x1248) = fVar31;
        if (ABS(fVar24 - fVar31) < 0.01) {
          *(float *)((long)self->density + uVar13 * 4 + lVar14) =
               ((float)iVar5 * fVar19 + 50.0) / fVar17;
        }
      }
      iVar5 = self->counter[lVar11];
      if (199 < iVar5) {
        self->counter[lVar11] = 0;
        iVar5 = 0;
        if (199 < self->updates) {
          for (uVar13 = 0; uVar13 < sVar12; uVar13 = uVar13 + 1) {
            dVar20 = exp((double)*(float *)((long)self->lquantile + uVar13 * 4 + lVar4 + -0x1248));
            self->quantile[uVar13] = (float)dVar20;
            sVar12 = self->magnLen;
          }
          iVar5 = self->counter[lVar11];
        }
      }
      self->counter[lVar11] = iVar5 + 1;
      lVar10 = lVar10 + 4;
    }
    if (self->updates < 200) {
      for (uVar13 = 0; uVar13 < sVar12; uVar13 = uVar13 + 1) {
        dVar20 = exp((double)self->lquantile[uVar8 + uVar13]);
        self->quantile[uVar13] = (float)dVar20;
        sVar12 = self->magnLen;
      }
    }
    for (uVar8 = 0; sVar12 != uVar8; uVar8 = uVar8 + 1) {
      noise[uVar8] = self->quantile[uVar8];
    }
    iVar5 = self->blockInd;
    if (iVar5 < 0x32) {
      self->whiteNoiseLevel = (fVar28 / (float)sVar12) * self->overdrive + self->whiteNoiseLevel;
      fVar24 = -(float)local_12c8._4_4_ * (float)local_12c8._4_4_ +
               (float)(sVar12 - 5) * (float)local_12a8._4_4_;
      fVar19 = ((float)local_12a8._4_4_ * (float)local_12c8._0_4_ +
               -(float)local_12c8._4_4_ * (float)local_12a8._0_4_) / fVar24;
      fVar24 = ((float)local_12c8._4_4_ * (float)local_12c8._0_4_ -
               (float)(sVar12 - 5) * (float)local_12a8._0_4_) / fVar24;
      fVar28 = 0.0;
      if (0.0 <= fVar24) {
        fVar28 = fVar24;
      }
      uVar1 = self->pinkNoiseNumerator;
      uVar2 = self->pinkNoiseExp;
      fVar19 = (float)uVar1 + (float)(~-(uint)(fVar19 < 0.0) & (uint)fVar19);
      fVar28 = (float)uVar2 +
               (float)(-(uint)(1.0 < fVar28) & 0x3f800000 | ~-(uint)(1.0 < fVar28) & (uint)fVar28);
      self->pinkNoiseNumerator = fVar19;
      self->pinkNoiseExp = fVar28;
      if (fVar28 <= 0.0) {
        fVar28 = 0.0;
        local_12c8._0_4_ = 0.0;
      }
      else {
        local_12c8._0_4_ = expf(fVar19 / (float)(iVar5 + 1));
        iVar5 = self->blockInd;
        local_12c8._0_4_ = (float)local_12c8._0_4_ * (float)(iVar5 + 1);
        fVar28 = fVar28 / (float)(iVar5 + 1);
      }
      for (uVar8 = 0; uVar8 < sVar12; uVar8 = uVar8 + 1) {
        if ((self->pinkNoiseExp != 0.0) || (NAN(self->pinkNoiseExp))) {
          uVar13 = 5;
          if (5 < uVar8) {
            uVar13 = uVar8;
          }
          fVar19 = powf((float)uVar13,fVar28);
          fVar19 = (float)local_12c8._0_4_ / fVar19;
          self->parametricNoise[uVar8] = fVar19;
          iVar5 = self->blockInd;
          sVar12 = self->magnLen;
        }
        else {
          fVar19 = self->whiteNoiseLevel;
          self->parametricNoise[uVar8] = fVar19;
        }
        noise[uVar8] = (((float)(0x32 - iVar5) * fVar19) / (float)(iVar5 + 1) +
                       (float)iVar5 * noise[uVar8]) / 50.0;
      }
    }
    if (iVar5 < 200) {
      self->featureData[5] =
           (fVar16 / (float)(unkint9)Var3 + (float)iVar5 * self->featureData[5]) /
           (float)(iVar5 + 1);
    }
    for (uVar8 = 0; sVar12 != uVar8; uVar8 = uVar8 + 1) {
      fVar16 = self->magnPrevAnalyze[uVar8];
      fVar28 = self->noisePrev[uVar8];
      fVar19 = self->smooth[uVar8];
      snrLocPost[uVar8] = 0.0;
      fVar24 = 0.0;
      if (noise[uVar8] < magn[uVar8]) {
        fVar24 = magn[uVar8] / (noise[uVar8] + 0.0001) + -1.0;
        snrLocPost[uVar8] = fVar24;
        fVar24 = fVar24 * 0.01999998;
      }
      snrLocPrior[uVar8] = (fVar16 / (fVar28 + 0.0001)) * fVar19 * 0.98 + fVar24;
    }
    fVar16 = self->sumMagn;
    fVar28 = 0.0;
    for (uVar8 = 1; uVar8 < sVar12; uVar8 = uVar8 + 1) {
      if (magn[uVar8] <= 0.0) {
        self->featureData[0] = self->featureData[0] * -0.3 + self->featureData[0];
        goto LAB_00185a72;
      }
      dVar20 = log((double)magn[uVar8]);
      fVar28 = fVar28 + (float)dVar20;
      sVar12 = self->magnLen;
    }
    dVar20 = exp((double)(fVar28 / (float)sVar12));
    self->featureData[0] =
         ((float)dVar20 / ((fVar16 - magn[0]) / (float)sVar12) - self->featureData[0]) * 0.3 +
         self->featureData[0];
    sVar12 = self->magnLen;
LAB_00185a72:
    fVar16 = 0.0;
    for (uVar8 = 0; sVar12 != uVar8; uVar8 = uVar8 + 1) {
      fVar16 = fVar16 + self->magnAvgPause[uVar8];
    }
    fVar19 = (float)sVar12;
    auVar23._4_4_ = self->sumMagn;
    auVar23._0_4_ = fVar16;
    auVar23._8_8_ = 0;
    auVar27._4_4_ = fVar19;
    auVar27._0_4_ = fVar19;
    auVar27._8_4_ = fVar19;
    auVar27._12_4_ = fVar19;
    auVar23 = divps(auVar23,auVar27);
    fVar16 = 0.0;
    fVar28 = 0.0;
    fVar24 = 0.0;
    for (uVar8 = 0; sVar12 != uVar8; uVar8 = uVar8 + 1) {
      fVar31 = self->magnAvgPause[uVar8] - auVar23._0_4_;
      fVar17 = magn[uVar8] - auVar23._4_4_;
      fVar24 = fVar24 + fVar17 * fVar31;
      fVar16 = fVar16 + fVar31 * fVar31;
      fVar28 = fVar28 + fVar17 * fVar17;
    }
    self->featureData[6] = self->signalEnergy + self->featureData[6];
    self->featureData[4] =
         ((fVar28 / fVar19 - ((fVar24 / fVar19) * (fVar24 / fVar19)) / (fVar16 / fVar19 + 0.0001)) /
          (self->featureData[5] + 0.0001) - self->featureData[4]) * 0.3 + self->featureData[4];
    if (0 < (int)uVar15) {
      iVar5 = self->modelUpdatePars[3];
      iVar6 = iVar5 + -1;
      self->modelUpdatePars[3] = iVar6;
      if (1 < iVar5) {
        FeatureParameterExtraction(self,0);
        iVar6 = self->modelUpdatePars[3];
      }
      if (iVar6 == 0) {
        FeatureParameterExtraction(self,1);
        self->modelUpdatePars[3] = self->modelUpdatePars[1];
        if (uVar15 == 1) {
          self->modelUpdatePars[0] = 0;
        }
        else {
          self->featureData[5] =
               (self->featureData[6] / (float)self->modelUpdatePars[1] + self->featureData[5]) * 0.5
          ;
          self->featureData[6] = 0.0;
        }
      }
    }
    fVar16 = self->priorModelPars[0];
    fVar28 = self->priorModelPars[1];
    fVar19 = self->priorModelPars[3];
    fVar24 = self->priorModelPars[2];
    fVar31 = self->priorModelPars[4];
    fVar17 = self->priorModelPars[5];
    fVar18 = self->priorModelPars[6];
    fVar30 = 0.0;
    for (uVar8 = 0; uVar8 < self->magnLen; uVar8 = uVar8 + 1) {
      fVar25 = snrLocPrior[uVar8] + snrLocPrior[uVar8];
      fVar29 = fVar25 + 1.0;
      fVar26 = snrLocPost[uVar8];
      dVar20 = log((double)fVar29);
      fVar26 = (((fVar26 + 1.0) * (fVar25 / (fVar29 + 0.0001)) - (float)dVar20) -
               self->logLrtTimeAvg[uVar8]) * 0.5 + self->logLrtTimeAvg[uVar8];
      self->logLrtTimeAvg[uVar8] = fVar26;
      fVar30 = fVar30 + fVar26;
    }
    iVar5 = (int)fVar24;
    fVar30 = fVar30 / (float)self->magnLen;
    self->featureData[3] = fVar30;
    uVar15 = -(uint)(fVar30 < fVar16);
    dVar20 = tanh((double)((fVar30 - fVar16) * (float)(~uVar15 & 0x40800000 | uVar15 & 0x41000000)))
    ;
    fVar16 = self->featureData[0];
    if (iVar5 == 1) {
      fVar24 = (float)(~-(uint)(fVar28 < fVar16) & 0x40800000 |
                      -(uint)(fVar28 < fVar16) & 0x41000000);
    }
    else {
      fVar24 = 4.0;
    }
    if (iVar5 == -1) {
      fVar24 = (float)(-(uint)(fVar16 < fVar28) & 0x41000000 |
                      ~-(uint)(fVar16 < fVar28) & (uint)fVar24);
    }
    dVar21 = tanh((double)((fVar28 - fVar16) * (float)iVar5 * fVar24));
    uVar15 = -(uint)(self->featureData[4] < fVar19);
    dVar22 = tanh((double)((self->featureData[4] - fVar19) *
                          (float)(~uVar15 & 0x40800000 | uVar15 & 0x41000000)));
    fVar28 = ((fVar31 * ((float)dVar20 + 1.0) * 0.5 + fVar17 * ((float)dVar21 + 1.0) * 0.5 +
              fVar18 * ((float)dVar22 + 1.0) * 0.5) - self->priorSpeechProb) * 0.1 +
             self->priorSpeechProb;
    fVar16 = 1.0;
    if (fVar28 <= 1.0) {
      fVar16 = fVar28;
    }
    fVar28 = 0.01;
    if (0.01 <= fVar16) {
      fVar28 = fVar16;
    }
    self->priorSpeechProb = fVar28;
    for (uVar8 = 0; uVar13 = self->magnLen, uVar8 < uVar13; uVar8 = uVar8 + 1) {
      dVar20 = exp((double)-self->logLrtTimeAvg[uVar8]);
      self->speechProb[uVar8] = 1.0 / ((float)dVar20 * ((1.0 - fVar28) / (fVar28 + 0.0001)) + 1.0);
    }
    pfVar7 = noise;
    fVar16 = 0.9;
    for (uVar8 = 0; uVar13 != uVar8; uVar8 = uVar8 + 1) {
      fVar28 = self->speechProb[uVar8];
      fVar19 = magn[uVar8];
      if (fVar28 < 0.2) {
        self->magnAvgPause[uVar8] =
             (fVar19 - self->magnAvgPause[uVar8]) * 0.05 + self->magnAvgPause[uVar8];
      }
      fVar24 = self->noisePrev[uVar8];
      fVar31 = (1.0 - fVar28) * fVar19 + fVar28 * fVar24;
      fVar19 = fVar16 * fVar24 + (1.0 - fVar16) * fVar31;
      fVar28 = *(float *)(&DAT_001aab60 + (ulong)(0.2 < fVar28) * 4);
      if ((fVar28 != fVar16) || (pfVar9 = pfVar7, NAN(fVar28) || NAN(fVar16))) {
        fVar16 = fVar24 * fVar28 + (1.0 - fVar28) * fVar31;
        *pfVar7 = fVar16;
        if (fVar19 < fVar16) {
          pfVar9 = noise + uVar8;
          goto LAB_00186052;
        }
      }
      else {
LAB_00186052:
        *pfVar9 = fVar19;
      }
      pfVar7 = pfVar7 + 1;
      fVar16 = fVar28;
    }
    memcpy(self->noise,noise,uVar13 << 2);
    memcpy(self->magnPrevAnalyze,magn,uVar13 << 2);
  }
  return;
}

Assistant:

void WebRtcNs_AnalyzeCore(NoiseSuppressionC* self, const float* speechFrame) {
  size_t i;
  const size_t kStartBand = 5;  // Skip first frequency bins during estimation.
  int updateParsFlag;
  float energy;
  float signalEnergy = 0.f;
  float sumMagn = 0.f;
  float tmpFloat1, tmpFloat2, tmpFloat3;
  float winData[ANAL_BLOCKL_MAX];
  float magn[HALF_ANAL_BLOCKL], noise[HALF_ANAL_BLOCKL];
  float snrLocPost[HALF_ANAL_BLOCKL], snrLocPrior[HALF_ANAL_BLOCKL];
  float real[ANAL_BLOCKL_MAX], imag[HALF_ANAL_BLOCKL];
  // Variables during startup.
  float sum_log_i = 0.0;
  float sum_log_i_square = 0.0;
  float sum_log_magn = 0.0;
  float sum_log_i_log_magn = 0.0;
  float parametric_exp = 0.0;
  float parametric_num = 0.0;

  // Check that initiation has been done.
  assert(self->initFlag == 1);
  updateParsFlag = self->modelUpdatePars[0];

  // Update analysis buffer for L band.
  UpdateBuffer(speechFrame, self->blockLen, self->anaLen, self->analyzeBuf);

  Windowing(self->window, self->analyzeBuf, self->anaLen, winData);
  energy = Energy(winData, self->anaLen);
  if (energy == 0.0) {
    // We want to avoid updating statistics in this case:
    // Updating feature statistics when we have zeros only will cause
    // thresholds to move towards zero signal situations. This in turn has the
    // effect that once the signal is "turned on" (non-zero values) everything
    // will be treated as speech and there is no noise suppression effect.
    // Depending on the duration of the inactive signal it takes a
    // considerable amount of time for the system to learn what is noise and
    // what is speech.
    return;
  }

  self->blockInd++;  // Update the block index only when we process a block.

  FFT(self, winData, self->anaLen, self->magnLen, real, imag, magn);

  for (i = 0; i < self->magnLen; i++) {
    signalEnergy += real[i] * real[i] + imag[i] * imag[i];
    sumMagn += magn[i];
    if (self->blockInd < END_STARTUP_SHORT) {
      if (i >= kStartBand) {
        tmpFloat2 = logf((float)i);
        sum_log_i += tmpFloat2;
        sum_log_i_square += tmpFloat2 * tmpFloat2;
        tmpFloat1 = logf(magn[i]);
        sum_log_magn += tmpFloat1;
        sum_log_i_log_magn += tmpFloat2 * tmpFloat1;
      }
    }
  }
  signalEnergy /= self->magnLen;
  self->signalEnergy = signalEnergy;
  self->sumMagn = sumMagn;

  // Quantile noise estimate.
  NoiseEstimation(self, magn, noise);
  // Compute simplified noise model during startup.
  if (self->blockInd < END_STARTUP_SHORT) {
    // Estimate White noise.
    self->whiteNoiseLevel += sumMagn / self->magnLen * self->overdrive;
    // Estimate Pink noise parameters.
    tmpFloat1 = sum_log_i_square * (self->magnLen - kStartBand);
    tmpFloat1 -= (sum_log_i * sum_log_i);
    tmpFloat2 =
        (sum_log_i_square * sum_log_magn - sum_log_i * sum_log_i_log_magn);
    tmpFloat3 = tmpFloat2 / tmpFloat1;
    // Constrain the estimated spectrum to be positive.
    if (tmpFloat3 < 0.f) {
      tmpFloat3 = 0.f;
    }
    self->pinkNoiseNumerator += tmpFloat3;
    tmpFloat2 = (sum_log_i * sum_log_magn);
    tmpFloat2 -= (self->magnLen - kStartBand) * sum_log_i_log_magn;
    tmpFloat3 = tmpFloat2 / tmpFloat1;
    // Constrain the pink noise power to be in the interval [0, 1].
    if (tmpFloat3 < 0.f) {
      tmpFloat3 = 0.f;
    }
    if (tmpFloat3 > 1.f) {
      tmpFloat3 = 1.f;
    }
    self->pinkNoiseExp += tmpFloat3;

    // Calculate frequency independent parts of parametric noise estimate.
    if (self->pinkNoiseExp > 0.f) {
      // Use pink noise estimate.
      parametric_num =
          expf(self->pinkNoiseNumerator / (float)(self->blockInd + 1));
      parametric_num *= (float)(self->blockInd + 1);
      parametric_exp = self->pinkNoiseExp / (float)(self->blockInd + 1);
    }
    for (i = 0; i < self->magnLen; i++) {
      // Estimate the background noise using the white and pink noise
      // parameters.
      if (self->pinkNoiseExp == 0.f) {
        // Use white noise estimate.
        self->parametricNoise[i] = self->whiteNoiseLevel;
      } else {
        // Use pink noise estimate.
        float use_band = (float)(i < kStartBand ? kStartBand : i);
        self->parametricNoise[i] =
            parametric_num / powf(use_band, parametric_exp);
      }
      // Weight quantile noise with modeled noise.
      noise[i] *= (self->blockInd);
      tmpFloat2 =
          self->parametricNoise[i] * (END_STARTUP_SHORT - self->blockInd);
      noise[i] += (tmpFloat2 / (float)(self->blockInd + 1));
      noise[i] /= END_STARTUP_SHORT;
    }
  }
  // Compute average signal during END_STARTUP_LONG time:
  // used to normalize spectral difference measure.
  if (self->blockInd < END_STARTUP_LONG) {
    self->featureData[5] *= self->blockInd;
    self->featureData[5] += signalEnergy;
    self->featureData[5] /= (self->blockInd + 1);
  }

  // Post and prior SNR needed for SpeechNoiseProb.
  ComputeSnr(self, magn, noise, snrLocPrior, snrLocPost);

  FeatureUpdate(self, magn, updateParsFlag);
  SpeechNoiseProb(self, self->speechProb, snrLocPrior, snrLocPost);
  UpdateNoiseEstimate(self, magn, snrLocPrior, snrLocPost, noise);

  // Keep track of noise spectrum for next frame.
  memcpy(self->noise, noise, sizeof(*noise) * self->magnLen);
  memcpy(self->magnPrevAnalyze, magn, sizeof(*magn) * self->magnLen);
}